

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O1

void ApprovalTests::
     TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
     verifyAll<std::initializer_list<int>>
               (string *header,initializer_list<int> *list,
               function<void_(int,_std::basic_ostream<char,_std::char_traits<char>_>_&)> *converter,
               Options *options)

{
  _Any_data _Stack_58;
  _Manager_type local_48;
  iterator local_38;
  iterator local_30;
  
  local_30 = list->_M_array;
  local_38 = local_30 + list->_M_len;
  ::std::function<void(int_const&,std::ostream&)>::
  function<std::function<void(int,std::ostream&)>&,void>
            ((function<void(int_const&,std::ostream&)> *)_Stack_58._M_pod_data,converter);
  TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
  verifyAll<const_int_*>
            (header,&local_30,&local_38,
             (function<void_(const_int_&,_std::basic_ostream<char,_std::char_traits<char>_>_&)> *)
             &_Stack_58,options);
  if (local_48 != (code *)0x0) {
    (*local_48)(&_Stack_58,&_Stack_58,__destroy_functor);
  }
  return;
}

Assistant:

static void verifyAll(
            const std::string& header,
            const Container& list,
            std::function<void(typename Container::value_type, std::ostream&)> converter,
            const Options& options = Options())
        {
            verifyAll<typename Container::const_iterator>(
                header, list.begin(), list.end(), converter, options);
        }